

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HestonLogSpotPathSimulator.cpp
# Opt level: O1

void __thiscall BroadieKayaScheme::preComputations(BroadieKayaScheme *this)

{
  iterator iVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong extraout_XMM0_Qb;
  HestonModel hestonModel;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  double local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  HestonModel local_70;
  
  HestonVariancePathSimulator::getHestonModel
            (&local_70,(this->super_HestonLogSpotPathSimulator).variancePathSimulator_);
  local_c8 = HestonModel::getCorrelation(&local_70);
  uStack_c0 = extraout_XMM0_Qb;
  local_d0 = HestonModel::getMeanReversionLevel(&local_70);
  local_d8 = HestonModel::getMeanReversionSpeed(&local_70);
  local_b8 = HestonModel::getVolOfVol(&local_70);
  pdVar2 = (this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((long)(this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish - (long)pdVar2 != 8) {
    local_d0 = local_d0 * -local_c8 * local_d8;
    local_a0 = &this->k0_;
    local_d8 = (local_d8 * local_c8) / local_b8 + -0.5;
    local_98 = local_c8 / local_b8;
    uStack_90 = uStack_c0;
    local_88 = -local_98;
    uStack_80 = uStack_c0 ^ 0x8000000000000000;
    local_a8 = &this->k1_;
    local_b0 = 1.0 - local_c8 * local_c8;
    uVar3 = 0;
    do {
      local_c8 = pdVar2[uVar3 + 1] - pdVar2[uVar3];
      local_e0 = (local_d0 * local_c8) / local_b8;
      iVar1._M_current =
           (this->k0_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->k0_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_a0,iVar1,&local_e0);
      }
      else {
        *iVar1._M_current = local_e0;
        (this->k0_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e0 = this->gamma1_ * local_c8 * local_d8 + local_88;
      iVar1._M_current =
           (this->k1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->k1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_a8,iVar1,&local_e0);
      }
      else {
        *iVar1._M_current = local_e0;
        (this->k1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e0 = this->gamma2_ * local_c8 * local_d8 + local_98;
      iVar1._M_current =
           (this->k2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->k2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->k2_,iVar1,&local_e0);
      }
      else {
        *iVar1._M_current = local_e0;
        (this->k2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e0 = this->gamma1_ * local_c8 * local_b0;
      iVar1._M_current =
           (this->k3_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->k3_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->k3_,iVar1,&local_e0);
      }
      else {
        *iVar1._M_current = local_e0;
        (this->k3_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e0 = local_c8 * this->gamma2_ * local_b0;
      iVar1._M_current =
           (this->k4_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->k4_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->k4_,iVar1,&local_e0);
      }
      else {
        *iVar1._M_current = local_e0;
        (this->k4_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar3 = uVar3 + 1;
      pdVar2 = (this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar3 < ((long)(this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_
                            .super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) - 1U);
  }
  return;
}

Assistant:

void BroadieKayaScheme::preComputations()
{
    HestonModel hestonModel = variancePathSimulator_->getHestonModel();
    double rho = hestonModel.getCorrelation();
    double theta = hestonModel.getMeanReversionLevel();
    double kappa = hestonModel.getMeanReversionSpeed();
    double eps = hestonModel.getVolOfVol();
    double delta;

    //NB : we allow the time grid to be non-equidistant so that the computed quantities are time dependent
    for(std::size_t i = 0; i < timePoints_.size()-1; i++)
    {
        delta = timePoints_[i+1] - timePoints_[i];
        k0_.push_back(-rho*kappa*theta*delta/eps);
        k1_.push_back(gamma1_*delta*(kappa*rho/eps-0.5)-rho/eps);
        k2_.push_back(gamma2_*delta*(kappa*rho/eps-0.5)+rho/eps);
        k3_.push_back(gamma1_*delta*(1.-rho*rho));
        k4_.push_back(gamma2_*delta*(1.-rho*rho));
    }
}